

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O2

uint32_t unpackLE(uint8_t *p,uint8_t u8Size)

{
  uint32_t value;
  uint32_t local_c;
  
  local_c = 0;
  if ((byte)(u8Size - 1) < 4) {
    local_c = 0;
    memcpy(&local_c,p,(ulong)u8Size);
  }
  return local_c;
}

Assistant:

_PACK_UINT32 unpackLE(const _PACK_UINT8* p, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_LITTLE_ENDIAN)
      _PACK_UINT32 value = 0u;
      memcpy(&value, p, u8Size);
      return value;
#else
      register _PACK_UINT32 tmp = 0;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         tmp = (tmp << 8) | *(p--);
         u8Size--;
      }
      return tmp;
#endif
   }
   return 0;
}